

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::expand_root
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          int key,bool expand_left)

{
  int *piVar1;
  longlong *plVar2;
  short sVar3;
  void *pvVar4;
  long lVar5;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *pAVar6;
  uint uVar7;
  int iVar8;
  AlexNode<int,_int> *pAVar9;
  AlexNode<int,_int> **ppAVar10;
  AlexNode<int,_int> **ppAVar11;
  data_node_type *pdVar12;
  long *plVar13;
  ulong uVar14;
  long lVar15;
  undefined7 in_register_00000011;
  ulong uVar16;
  data_node_type *pdVar17;
  int iVar18;
  ulong uVar19;
  data_node_type *this_00;
  int iVar20;
  long lVar21;
  int iVar22;
  AlexNode<int,_int> *pAVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 in_XMM3_Qb;
  long lStack_90;
  int local_7c;
  int local_78;
  new_allocator<alex::AlexNode<int,_int>_*> local_72;
  new_allocator<alex::AlexNode<int,_int>_*> local_71;
  data_node_type *local_70;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *local_68;
  int local_60;
  int local_5c;
  int right_boundary_value;
  int left_boundary_value;
  long local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  local_7c = (this->istats_).key_domain_max_;
  local_78 = (this->istats_).key_domain_min_;
  pAVar23 = this->root_node_;
  iVar22 = local_7c - local_78;
  local_60 = iVar22;
  if ((int)CONCAT71(in_register_00000011,expand_left) == 0) {
    iVar20 = get_max_key(this);
    if (iVar20 <= key) {
      iVar20 = key;
    }
    uVar7 = pow_2_round_up((iVar20 + ~(this->istats_).key_domain_max_ + iVar22) / iVar22 + 1);
    iVar20 = (this->istats_).key_domain_min_;
    iVar22 = ((int)uVar7 / 2) * iVar22;
    (this->istats_).num_keys_at_last_right_domain_resize = (this->stats_).num_keys;
    local_7c = 0x7fffffff;
    if (iVar22 <= iVar20 / -2 + 0x3fffffff) {
      local_7c = iVar20 + iVar22 * 2;
    }
    (this->istats_).num_keys_above_key_domain = 0;
    local_70 = last_data_node(this);
  }
  else {
    uVar7 = get_min_key(this);
    if (key <= (int)uVar7) {
      uVar7 = key;
    }
    uVar7 = pow_2_round_up((int)(~uVar7 + local_7c) / iVar22 + 1);
    iVar20 = (this->istats_).key_domain_max_;
    iVar22 = ((int)uVar7 / 2) * iVar22;
    (this->istats_).num_keys_at_last_left_domain_resize = (this->stats_).num_keys;
    local_78 = -0x80000000;
    if (iVar22 <= iVar20 / 2 + 0x40000000) {
      local_78 = iVar20 + iVar22 * -2;
    }
    (this->istats_).num_keys_below_key_domain = 0;
    local_70 = first_data_node(this);
  }
  uVar19 = (ulong)uVar7;
  if (1 < (int)uVar7) {
    iVar22 = *(int *)&pAVar23[1].is_leaf_;
    uVar16 = (ulong)(this->derived_params_).max_fanout;
    uVar14 = (long)iVar22 * uVar19;
    local_68 = this;
    if (uVar14 < uVar16 || uVar14 - uVar16 == 0) {
      piVar1 = &(this->stats_).num_model_node_expansions;
      *piVar1 = *piVar1 + 1;
      plVar2 = &(this->stats_).num_model_node_expansion_pointers;
      *plVar2 = *plVar2 + (long)iVar22;
      iVar22 = uVar7 * iVar22;
      lVar15 = 0;
      ppAVar11 = __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                           (&local_71,(long)iVar22,(void *)0x0);
      uVar7 = *(uint *)&pAVar23[1].is_leaf_;
      uVar19 = (ulong)uVar7;
      iVar20 = iVar22;
      if (expand_left) {
        iVar20 = iVar22 - uVar7;
        uVar19 = 0;
        lVar15 = (long)iVar20;
        (pAVar23->model_).b_ = (double)iVar20 + (pAVar23->model_).b_;
      }
      for (uVar14 = 0; pvVar4 = (void *)pAVar23[1].model_.a_,
          (~((int)uVar7 >> 0x1f) & uVar7) != uVar14; uVar14 = uVar14 + 1) {
        ppAVar11[lVar15 + uVar14] = *(AlexNode<int,_int> **)((long)pvVar4 + uVar14 * 8);
      }
      operator_delete(pvVar4,(long)(int)uVar7 << 3);
      pAVar23[1].model_.a_ = (double)ppAVar11;
      *(int *)&pAVar23[1].is_leaf_ = iVar22;
    }
    else {
      pAVar9 = (AlexNode<int,_int> *)operator_new(0x40);
      sVar3 = pAVar23->level_;
      pAVar9->is_leaf_ = false;
      pAVar9->duplication_factor_ = '\0';
      pAVar9->level_ = sVar3 + -1;
      pAVar9->cost_ = 0.0;
      pAVar9->_vptr_AlexNode = (_func_int **)&PTR__AlexModelNode_00156b98;
      pAVar9[1]._vptr_AlexNode = (_func_int **)&this->field_0xbd;
      pAVar9[1].model_.a_ = 0.0;
      iVar22._0_1_ = pAVar23[1].is_leaf_;
      iVar22._1_1_ = pAVar23[1].duplication_factor_;
      iVar22._2_2_ = pAVar23[1].level_;
      (pAVar9->model_).a_ = (pAVar23->model_).a_ / (double)iVar22;
      dVar24 = (pAVar23->model_).b_ / (double)iVar22;
      (pAVar9->model_).b_ =
           (double)((ulong)expand_left * (long)(dVar24 + (double)(int)(uVar7 - 1)) +
                   (ulong)!expand_left * (long)dVar24);
      pAVar9[1].is_leaf_ = (bool)(char)uVar7;
      pAVar9[1].duplication_factor_ = (char)(uVar7 >> 8);
      pAVar9[1].level_ = (short)(uVar7 >> 0x10);
      ppAVar10 = __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                           (&local_72,uVar19,(void *)0x0);
      pAVar9[1].model_.a_ = (double)ppAVar10;
      ppAVar11 = ppAVar10 + (uVar19 - 1);
      if (!expand_left) {
        ppAVar11 = ppAVar10;
      }
      uVar19 = (ulong)!expand_left;
      *ppAVar11 = pAVar23;
      this->root_node_ = pAVar9;
      iVar20 = (uVar7 - 1) + (uint)!expand_left;
      update_superroot_pointer(this);
      pAVar23 = pAVar9;
    }
    auVar25._8_8_ = 0;
    auVar25._0_8_ = (pAVar23->model_).a_;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = (pAVar23->model_).b_;
    iVar22 = (int)uVar19;
    if (expand_left) {
      auVar27._0_8_ = (double)local_78;
      auVar27._8_8_ = in_XMM3_Qb;
      auVar25 = vfmadd213sd_fma(auVar27,auVar25,auVar26);
      iVar8 = (int)auVar25._0_8_;
      if ((int)auVar25._0_8_ < iVar22) {
        iVar8 = iVar22;
      }
      local_50 = CONCAT44(local_50._4_4_,iVar8);
      iVar8 = iVar20;
    }
    else {
      auVar28._0_8_ = (double)local_7c;
      auVar28._8_8_ = in_XMM3_Qb;
      local_50 = CONCAT44(local_50._4_4_,iVar22);
      auVar25 = vfmadd213sd_fma(auVar28,auVar25,auVar26);
      iVar8 = (int)auVar25._0_8_ + 1;
      if (iVar20 <= iVar8) {
        iVar8 = iVar20;
      }
    }
    iVar18 = (iVar22 - iVar20) + *(int *)&pAVar23[1].is_leaf_;
    if (*(int *)&pAVar23[1].is_leaf_ % iVar18 != 0) {
      __assert_fail("root->num_children_ % n == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                    ,0x5d2,
                    "void alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::expand_root(T, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                   );
    }
    local_5c = log_2_round_down(iVar18);
    this_00 = local_70;
    local_38 = (long)iVar20;
    local_40 = uVar19;
    if (expand_left) {
      local_48 = CONCAT44(local_48._4_4_,iVar18);
      left_boundary_value = (local_68->istats_).key_domain_min_;
      iVar22 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
               ::lower_bound<int>(local_70,&left_boundary_value);
      pdVar17 = this_00;
      while ((int)uVar19 < iVar20) {
        iVar18 = iVar20 - (int)local_48;
        iVar8 = 0;
        if ((int)local_50 < iVar18) {
          left_boundary_value = left_boundary_value - local_60;
          iVar8 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                  ::lower_bound<int>(this_00,&left_boundary_value);
          this_00 = local_70;
        }
        pdVar12 = bulk_load_leaf_node_from_existing
                            (local_68,this_00,iVar8,iVar22,true,(FTNode *)0x0,false,false,false);
        (pdVar12->super_AlexNode<int,_int>).level_ = pAVar23->level_ + 1;
        (pdVar12->super_AlexNode<int,_int>).duplication_factor_ = (uint8_t)local_5c;
        if (pdVar17 != (data_node_type *)0x0) {
          pdVar17->prev_leaf_ = pdVar12;
        }
        pdVar12->next_leaf_ = pdVar17;
        for (lVar15 = (long)iVar20; pdVar17 = pdVar12, this_00 = local_70, uVar19 = local_40,
            iVar20 = iVar18, iVar22 = iVar8, iVar18 < lVar15; lVar15 = lVar15 + -1) {
          *(data_node_type **)((long)pAVar23[1].model_.a_ + -8 + lVar15 * 8) = pdVar12;
        }
      }
    }
    else {
      right_boundary_value = (local_68->istats_).key_domain_max_;
      iVar20 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
               ::lower_bound<int>(local_70,&right_boundary_value);
      local_48 = (long)iVar8;
      local_50 = (long)iVar18;
      pdVar17 = (data_node_type *)0x0;
      lVar15 = (long)iVar22;
      while (lVar15 < local_38) {
        lVar5 = lVar15 + local_50;
        if (lVar5 < local_48) {
          right_boundary_value = right_boundary_value + local_60;
          iVar22 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                   ::lower_bound<int>(this_00,&right_boundary_value);
          this_00 = local_70;
        }
        else {
          iVar22 = this_00->data_capacity_;
        }
        pdVar12 = bulk_load_leaf_node_from_existing
                            (local_68,this_00,iVar20,iVar22,true,(FTNode *)0x0,false,false,false);
        (pdVar12->super_AlexNode<int,_int>).level_ = pAVar23->level_ + 1;
        (pdVar12->super_AlexNode<int,_int>).duplication_factor_ = (uint8_t)local_5c;
        if (pdVar17 != (data_node_type *)0x0) {
          pdVar17->next_leaf_ = pdVar12;
        }
        pdVar12->prev_leaf_ = pdVar17;
        for (lVar21 = lVar15; pdVar17 = pdVar12, this_00 = local_70, lVar15 = lVar5, iVar20 = iVar22
            , lVar21 < lVar5; lVar21 = lVar21 + 1) {
          *(data_node_type **)((long)pAVar23[1].model_.a_ + lVar21 * 8) = pdVar12;
        }
      }
    }
    pAVar6 = local_68;
    if (expand_left) {
      AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
      erase_range(this_00,local_78,(local_68->istats_).key_domain_min_,false);
      plVar13 = (long *)((long)pAVar23[1].model_.a_ + -8 + local_38 * 8);
      lVar15 = 0x38;
      lStack_90 = 0x40;
    }
    else {
      AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
      erase_range(this_00,(local_68->istats_).key_domain_max_,local_7c,true);
      plVar13 = (long *)((long)(int)local_40 * 8 + (long)pAVar23[1].model_.a_);
      lVar15 = 0x40;
      lStack_90 = 0x38;
    }
    lVar5 = *plVar13;
    *(long *)((long)&(this_00->super_AlexNode<int,_int>)._vptr_AlexNode + lStack_90) = lVar5;
    *(data_node_type **)(lVar5 + lVar15) = this_00;
    (pAVar6->istats_).key_domain_min_ = local_78;
    (pAVar6->istats_).key_domain_max_ = local_7c;
    return;
  }
  __assert_fail("expansion_factor > 1",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                ,0x589,
                "void alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::expand_root(T, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
               );
}

Assistant:

void expand_root(T key, bool expand_left) {
    auto root = static_cast<model_node_type*>(root_node_);

    // Find the new bounds of the key domain.
    // Need to be careful to avoid overflows in the key type.
    T domain_size = istats_.key_domain_max_ - istats_.key_domain_min_;
    int expansion_factor;
    T new_domain_min = istats_.key_domain_min_;
    T new_domain_max = istats_.key_domain_max_;
    data_node_type* outermost_node;
    if (expand_left) {
      if constexpr (std::is_integral<T>::value){
        T key_difference = istats_.key_domain_min_ - std::min(key, get_min_key());
        expansion_factor = pow_2_round_up((key_difference + domain_size - 1) / domain_size + 1);
      }
      else{
        auto key_difference = static_cast<double>(istats_.key_domain_min_ -
                                                std::min(key, get_min_key()));
        expansion_factor = pow_2_round_up(static_cast<int>(
            std::ceil((key_difference + domain_size) / domain_size)));
      }
      // Check for overflow. To avoid overflow on signed types while doing
      // this check, we do comparisons using half of the relevant quantities.
      T half_expandable_domain =
          istats_.key_domain_max_ / 2 - std::numeric_limits<T>::lowest() / 2;
      T half_expanded_domain_size = expansion_factor / 2 * domain_size;
      if (half_expandable_domain < half_expanded_domain_size) {
        new_domain_min = std::numeric_limits<T>::lowest();
      } else {
        new_domain_min = istats_.key_domain_max_;
        new_domain_min -= half_expanded_domain_size;
        new_domain_min -= half_expanded_domain_size;
      }
      istats_.num_keys_at_last_left_domain_resize = stats_.num_keys;
      istats_.num_keys_below_key_domain = 0;
      outermost_node = first_data_node();
    } else {
      if constexpr (std::is_integral<T>::value){
        T key_difference = std::max(key, get_max_key()) - istats_.key_domain_max_;
        expansion_factor = pow_2_round_up((key_difference + domain_size - 1) / domain_size + 1);
      }
      else{
        auto key_difference = static_cast<double>(std::max(key, get_max_key()) -
                                                istats_.key_domain_max_);
        expansion_factor = pow_2_round_up(static_cast<int>(
            std::ceil((key_difference + domain_size) / domain_size)));
      }
      // Check for overflow. To avoid overflow on signed types while doing
      // this check, we do comparisons using half of the relevant quantities.
      T half_expandable_domain =
          std::numeric_limits<T>::max() / 2 - istats_.key_domain_min_ / 2;
      T half_expanded_domain_size = expansion_factor / 2 * domain_size;
      if (half_expandable_domain < half_expanded_domain_size) {
        new_domain_max = std::numeric_limits<T>::max();
      } else {
        new_domain_max = istats_.key_domain_min_;
        new_domain_max += half_expanded_domain_size;
        new_domain_max += half_expanded_domain_size;
      }
      istats_.num_keys_at_last_right_domain_resize = stats_.num_keys;
      istats_.num_keys_above_key_domain = 0;
      outermost_node = last_data_node();
    }
    assert(expansion_factor > 1);

    // Modify the root node appropriately
    int new_nodes_start;  // index of first pointer to a new node
    int new_nodes_end;    // exclusive
    if (static_cast<size_t>(root->num_children_) * expansion_factor <=
        static_cast<size_t>(derived_params_.max_fanout)) {
      // Expand root node
      stats_.num_model_node_expansions++;
      stats_.num_model_node_expansion_pointers += root->num_children_;

      int new_num_children = root->num_children_ * expansion_factor;
      auto new_children = new (pointer_allocator().allocate(new_num_children))
          AlexNode<T, P>*[new_num_children];
      int copy_start;
      if (expand_left) {
        copy_start = new_num_children - root->num_children_;
        new_nodes_start = 0;
        new_nodes_end = copy_start;
        root->model_.b_ += new_num_children - root->num_children_;
      } else {
        copy_start = 0;
        new_nodes_start = root->num_children_;
        new_nodes_end = new_num_children;
      }
      for (int i = 0; i < root->num_children_; i++) {
        new_children[copy_start + i] = root->children_[i];
      }
      pointer_allocator().deallocate(root->children_, root->num_children_);
      root->children_ = new_children;
      root->num_children_ = new_num_children;
    } else {
      // Create new root node
      auto new_root = new (model_node_allocator().allocate(1))
          model_node_type(static_cast<short>(root->level_ - 1), allocator_);
      new_root->model_.a_ = root->model_.a_ / root->num_children_;
      new_root->model_.b_ = root->model_.b_ / root->num_children_;
      if (expand_left) {
        new_root->model_.b_ += expansion_factor - 1;
      }
      new_root->num_children_ = expansion_factor;
      new_root->children_ = new (pointer_allocator().allocate(expansion_factor))
          AlexNode<T, P>*[expansion_factor];
      if (expand_left) {
        new_root->children_[expansion_factor - 1] = root;
        new_nodes_start = 0;
      } else {
        new_root->children_[0] = root;
        new_nodes_start = 1;
      }
      new_nodes_end = new_nodes_start + expansion_factor - 1;
      root_node_ = new_root;
      update_superroot_pointer();
      root = new_root;
    }
    // Determine if new nodes represent a range outside the key type's domain.
    // This happens when we're preventing overflows.
    int in_bounds_new_nodes_start = new_nodes_start;
    int in_bounds_new_nodes_end = new_nodes_end;
    if (expand_left) {
      in_bounds_new_nodes_start =
          std::max(new_nodes_start, root->model_.predict(new_domain_min));
    } else {
      in_bounds_new_nodes_end =
          std::min(new_nodes_end, root->model_.predict(new_domain_max) + 1);
    }

    // Fill newly created child pointers of the root node with new data nodes.
    // To minimize empty new data nodes, we create a new data node per n child
    // pointers, where n is the number of pointers to existing nodes.
    // Requires reassigning some keys from the outermost pre-existing data node
    // to the new data nodes.
    int n = root->num_children_ - (new_nodes_end - new_nodes_start);
    assert(root->num_children_ % n == 0);
    auto new_node_duplication_factor =
        static_cast<uint8_t>(log_2_round_down(n));
    if (expand_left) {
      T left_boundary_value = istats_.key_domain_min_;
      int left_boundary = outermost_node->lower_bound(left_boundary_value);
      data_node_type* next = outermost_node;
      for (int i = new_nodes_end; i > new_nodes_start; i -= n) {
        // if (i <= in_bounds_new_nodes_start) {
        //   // Do not initialize nodes that fall outside the key type's domain
        //   break;
        // }
        int right_boundary = left_boundary;
        if (i - n <= in_bounds_new_nodes_start) {
          left_boundary = 0;
        } else {
          left_boundary_value -= domain_size;
          left_boundary = outermost_node->lower_bound(left_boundary_value);
        }
        data_node_type* new_node = bulk_load_leaf_node_from_existing(
            outermost_node, left_boundary, right_boundary, true);
        new_node->level_ = static_cast<short>(root->level_ + 1);
        new_node->duplication_factor_ = new_node_duplication_factor;
        if (next) {
          next->prev_leaf_ = new_node;
        }
        new_node->next_leaf_ = next;
        next = new_node;
        for (int j = i - 1; j >= i - n; j--) {
          root->children_[j] = new_node;
        }
      }
    } else {
      T right_boundary_value = istats_.key_domain_max_;
      int right_boundary = outermost_node->lower_bound(right_boundary_value);
      data_node_type* prev = nullptr;
      for (int i = new_nodes_start; i < new_nodes_end; i += n) {
        // if (i >= in_bounds_new_nodes_end) {
        //   // Do not initialize nodes that fall outside the key type's domain
        //   break;
        // }
        int left_boundary = right_boundary;
        if (i + n >= in_bounds_new_nodes_end) {
          right_boundary = outermost_node->data_capacity_;
        } else {
          right_boundary_value += domain_size;
          right_boundary = outermost_node->lower_bound(right_boundary_value);
        }
        data_node_type* new_node = bulk_load_leaf_node_from_existing(
            outermost_node, left_boundary, right_boundary, true);
        new_node->level_ = static_cast<short>(root->level_ + 1);
        new_node->duplication_factor_ = new_node_duplication_factor;
        if (prev) {
          prev->next_leaf_ = new_node;
        }
        new_node->prev_leaf_ = prev;
        prev = new_node;
        for (int j = i; j < i + n; j++) {
          root->children_[j] = new_node;
        }
      }
    }

    // Connect leaf nodes and remove reassigned keys from outermost pre-existing
    // node.
    if (expand_left) {
      outermost_node->erase_range(new_domain_min, istats_.key_domain_min_);
      auto last_new_leaf =
          static_cast<data_node_type*>(root->children_[new_nodes_end - 1]);
      outermost_node->prev_leaf_ = last_new_leaf;
      last_new_leaf->next_leaf_ = outermost_node;
    } else {
      outermost_node->erase_range(istats_.key_domain_max_, new_domain_max,
                                  true);
      auto first_new_leaf =
          static_cast<data_node_type*>(root->children_[new_nodes_start]);
      outermost_node->next_leaf_ = first_new_leaf;
      first_new_leaf->prev_leaf_ = outermost_node;
    }

    istats_.key_domain_min_ = new_domain_min;
    istats_.key_domain_max_ = new_domain_max;
  }